

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O0

double __thiscall
jsoncons::basic_staj_event<char>::as_double(basic_staj_event<char> *this,error_code *ec)

{
  undefined8 uVar1;
  char *in_RSI;
  chars_to *in_RDI;
  undefined1 auVar2 [16];
  double x;
  chars_to f;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffe0;
  type_conflict1 local_8;
  
  switch((in_RDI->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Tp_alloc_type) {
  case (_Tp_alloc_type)0x0:
  case (_Tp_alloc_type)0x1:
    detail::chars_to::chars_to(in_RDI);
    local_8 = detail::chars_to::operator()(in_RDI,in_RSI,in_stack_ffffffffffffffe0);
    detail::chars_to::~chars_to((chars_to *)0x271603);
    break;
  default:
    std::error_code::operator=
              ((error_code *)in_RDI,(conv_errc)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    local_8 = 0.0;
    break;
  case (_Tp_alloc_type)0x5:
    local_8 = (type_conflict1)
              *(long *)&(in_RDI->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        field_0x10;
    break;
  case (_Tp_alloc_type)0x6:
    uVar1 = *(undefined8 *)
             &(in_RDI->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
    auVar2._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar2._0_8_ = uVar1;
    auVar2._12_4_ = 0x45300000;
    local_8 = (auVar2._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
    break;
  case (_Tp_alloc_type)0x8:
    local_8 = binary::decode_half((uint16_t)((ulong)in_stack_ffffffffffffffb0 >> 0x30));
    break;
  case (_Tp_alloc_type)0x9:
    local_8 = *(type_conflict1 *)
               &(in_RDI->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
    ;
  }
  return local_8;
}

Assistant:

double as_double(std::error_code& ec) const
    {
        switch (event_type_)
        {
            case staj_event_type::key:
            case staj_event_type::string_value:
            {
                jsoncons::detail::chars_to f;
                return f(value_.string_data_, length_);
            }
            case staj_event_type::double_value:
                return value_.double_value_;
            case staj_event_type::int64_value:
                return static_cast<double>(value_.int64_value_);
            case staj_event_type::uint64_value:
                return static_cast<double>(value_.uint64_value_);
            case staj_event_type::half_value:
            {
                double x = binary::decode_half(value_.half_value_);
                return static_cast<double>(x);
            }
            default:
                ec = conv_errc::not_double;
                return double();
        }
    }